

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

JavascriptPromiseReaction *
TTD::NSSnapValues::InflatePromiseReactionInfo
          (SnapPromiseReactionInfo *reactionInfo,ScriptContext *ctx,InflateMap *inflator)

{
  bool bVar1;
  RecyclableObject *handler;
  JavascriptPromiseCapability *capabilities;
  JavascriptPromiseReaction *pJVar2;
  
  bVar1 = InflateMap::IsPromiseInfoDefined<Js::JavascriptPromiseReaction>
                    (inflator,reactionInfo->PromiseReactionId);
  if (!bVar1) {
    handler = InflateMap::LookupObject(inflator,reactionInfo->HandlerObjId);
    capabilities = InflatePromiseCapabilityInfo(&reactionInfo->Capabilities,ctx,inflator);
    pJVar2 = Js::JavascriptLibrary::CreatePromiseReaction_TTD
                       ((ctx->super_ScriptContextBase).javascriptLibrary,handler,capabilities);
    InflateMap::AddInflatedPromiseInfo<Js::JavascriptPromiseReaction>
              (inflator,reactionInfo->PromiseReactionId,pJVar2);
  }
  pJVar2 = InflateMap::LookupInflatedPromiseInfo<Js::JavascriptPromiseReaction>
                     (inflator,reactionInfo->PromiseReactionId);
  return pJVar2;
}

Assistant:

Js::JavascriptPromiseReaction* InflatePromiseReactionInfo(const SnapPromiseReactionInfo* reactionInfo, Js::ScriptContext* ctx, InflateMap* inflator)
        {
            if(!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseReaction>(reactionInfo->PromiseReactionId))
            {
                Js::RecyclableObject* handler = inflator->LookupObject(reactionInfo->HandlerObjId);
                Js::JavascriptPromiseCapability* capabilities = InflatePromiseCapabilityInfo(&reactionInfo->Capabilities, ctx, inflator);

                Js::JavascriptPromiseReaction* res = ctx->GetLibrary()->CreatePromiseReaction_TTD(handler, capabilities);
                inflator->AddInflatedPromiseInfo<Js::JavascriptPromiseReaction>(reactionInfo->PromiseReactionId, res);
            }

            return inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseReaction>(reactionInfo->PromiseReactionId);
        }